

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O0

int __thiscall QGuiApplicationPrivate::init(QGuiApplicationPrivate *this)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  QOpenGLContext *pQVar6;
  QGuiApplication *context;
  QMessageLogger *this_00;
  QString *t;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  TasInitialize initFunction;
  QGuiApplication *q;
  QOpenGLContext *ctx;
  qsizetype p;
  char *arg;
  int i;
  int j;
  bool loadTestability;
  char16_t *str;
  QLibrary testLib;
  QByteArray envPlugins;
  QString s;
  QString session_key;
  QString session_id;
  QList<QByteArray> pluginList;
  undefined4 in_stack_fffffffffffffd28;
  CaseSensitivity in_stack_fffffffffffffd2c;
  undefined4 in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd34;
  QObject *in_stack_fffffffffffffd38;
  QByteArrayView *in_stack_fffffffffffffd40;
  Object *in_stack_fffffffffffffd48;
  Object *in_stack_fffffffffffffd50;
  QGuiApplicationPrivate *in_stack_fffffffffffffd70;
  Object *in_stack_fffffffffffffd80;
  qsizetype in_stack_fffffffffffffd88;
  QFlagsStorage<QEventLoop::ProcessEventsFlag> flags;
  char *local_270;
  int local_264;
  uint in_stack_fffffffffffffda4;
  ConnectionType type;
  undefined8 in_stack_fffffffffffffdc0;
  Connection local_228 [8];
  char local_220 [88];
  QDebug local_1c8;
  QArrayDataPointer<char16_t> local_1c0;
  undefined1 local_1a8 [24];
  undefined1 *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  undefined1 local_168 [24];
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  storage_type *local_138;
  undefined1 local_128 [24];
  char *local_110;
  storage_type *local_108;
  undefined1 local_f8 [48];
  undefined1 local_c8 [30];
  QChar local_aa;
  storage_type *local_a8;
  undefined1 local_98 [24];
  QByteArray local_80;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QCoreApplicationPrivate::init();
  QCoreApplicationPrivate::is_app_running._0_1_ = 0;
  in_stack_fffffffffffffda4 = in_stack_fffffffffffffda4 & 0xffffff;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QByteArray>::QList((QList<QByteArray> *)0x35d16f);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x35d1a9);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x35d1e3);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x35d21d);
  uVar3 = (uint)(**(int **)&this->field_0x80 != 0);
  local_264 = 1;
  while( true ) {
    type = (ConnectionType)in_stack_fffffffffffffdc0;
    flags.i = (Int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
    if (**(int **)&this->field_0x80 <= local_264) break;
    if (*(long *)(*(long *)&this->field_0x88 + (long)local_264 * 8) != 0) {
      if (**(char **)(*(long *)&this->field_0x88 + (long)local_264 * 8) == '-') {
        local_270 = *(char **)(*(long *)&this->field_0x88 + (long)local_264 * 8);
        if (local_270[1] == '-') {
          local_270 = local_270 + 1;
        }
        iVar4 = strcmp(local_270,"-plugin");
        if (iVar4 == 0) {
          local_264 = local_264 + 1;
          if (local_264 < **(int **)&this->field_0x80) {
            QByteArray::QByteArray
                      (&local_80,*(char **)(*(long *)&this->field_0x88 + (long)local_264 * 8),-1);
            QList<QByteArray>::operator<<
                      ((QList<QByteArray> *)
                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                       (rvalue_ref)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
            QByteArray::~QByteArray((QByteArray *)0x35d37d);
          }
        }
        else {
          iVar4 = strcmp(local_270,"-reverse");
          if (iVar4 == 0) {
            force_reverse = true;
          }
          else {
            iVar4 = strcmp(local_270,"-session");
            if ((iVar4 == 0) && (local_264 < **(int **)&this->field_0x80 + -1)) {
              local_264 = local_264 + 1;
              if ((*(long *)(*(long *)&this->field_0x88 + (long)local_264 * 8) != 0) &&
                 (**(char **)(*(long *)&this->field_0x88 + (long)local_264 * 8) != '\0')) {
                QByteArrayView::QByteArrayView<char_*,_true>
                          (in_stack_fffffffffffffd40,(char **)in_stack_fffffffffffffd38);
                QVar7.m_data = local_a8;
                QVar7.m_size = (qsizetype)local_98;
                QString::fromLatin1(QVar7);
                QString::operator=((QString *)
                                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                   (QString *)
                                   CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
                QString::~QString((QString *)0x35d484);
                QChar::QChar<char16_t,_true>(&local_aa,L'_');
                in_stack_fffffffffffffd88 =
                     QString::indexOf((QString *)in_stack_fffffffffffffd38,
                                      (QChar)(char16_t)((ulong)this >> 0x30),
                                      CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                      in_stack_fffffffffffffd2c);
                if (-1 < in_stack_fffffffffffffd88) {
                  QString::mid((longlong)local_c8,(longlong)&local_38);
                  QString::operator=((QString *)
                                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                     (QString *)
                                     CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
                  QString::~QString((QString *)0x35d50c);
                  QString::left((QString *)in_stack_fffffffffffffd48,
                                (qsizetype)in_stack_fffffffffffffd40);
                  QString::operator=((QString *)
                                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                     (QString *)
                                     CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
                  QString::~QString((QString *)0x35d548);
                }
                this->is_session_restored = true;
              }
            }
            else {
              iVar4 = strcmp(local_270,"-testability");
              if (iVar4 == 0) {
                in_stack_fffffffffffffda4 = CONCAT13(1,(int3)in_stack_fffffffffffffda4);
              }
              else {
                iVar4 = strncmp(local_270,"-style=",7);
                if (iVar4 == 0) {
                  local_110 = local_270 + 7;
                  QByteArrayView::QByteArrayView<const_char_*,_true>
                            (in_stack_fffffffffffffd40,(char **)in_stack_fffffffffffffd38);
                  QVar8.m_data = local_108;
                  QVar8.m_size = (qsizetype)local_f8;
                  QString::fromLocal8Bit(QVar8);
                  QString::operator=((QString *)
                                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                     (QString *)
                                     CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
                  QString::~QString((QString *)0x35d5f9);
                }
                else {
                  iVar4 = strcmp(local_270,"-style");
                  if ((iVar4 == 0) && (local_264 < **(int **)&this->field_0x80 + -1)) {
                    local_264 = local_264 + 1;
                    QByteArrayView::QByteArrayView<char_*,_true>
                              (in_stack_fffffffffffffd40,(char **)in_stack_fffffffffffffd38);
                    QVar9.m_data = local_138;
                    QVar9.m_size = (qsizetype)local_128;
                    QString::fromLocal8Bit(QVar9);
                    QString::operator=((QString *)
                                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
                                       ,(QString *)
                                        CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                                                ));
                    QString::~QString((QString *)0x35d69d);
                  }
                  else {
                    *(undefined8 *)(*(long *)&this->field_0x88 + (long)(int)uVar3 * 8) =
                         *(undefined8 *)(*(long *)&this->field_0x88 + (long)local_264 * 8);
                    uVar3 = uVar3 + 1;
                  }
                }
              }
            }
          }
        }
        bVar1 = QString::isEmpty((QString *)0x35d6e6);
        if (!bVar1) {
          QString::operator=(&styleOverride,(QString *)&local_68);
        }
      }
      else {
        *(undefined8 *)(*(long *)&this->field_0x88 + (long)(int)uVar3 * 8) =
             *(undefined8 *)(*(long *)&this->field_0x88 + (long)local_264 * 8);
        uVar3 = uVar3 + 1;
      }
    }
    local_264 = local_264 + 1;
  }
  if ((int)uVar3 < **(int **)&this->field_0x80) {
    *(undefined8 *)(*(long *)&this->field_0x88 + (long)(int)uVar3 * 8) = 0;
    **(uint **)&this->field_0x80 = uVar3;
  }
  local_150 = &DAT_aaaaaaaaaaaaaaaa;
  local_148 = &DAT_aaaaaaaaaaaaaaaa;
  local_140 = &DAT_aaaaaaaaaaaaaaaa;
  qgetenv((char *)&local_150);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x35d798);
  if (!bVar1) {
    QByteArray::split((char)local_168);
    QList<QByteArray>::operator+=
              ((QList<QByteArray> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (QList<QByteArray> *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    QList<QByteArray>::~QList((QList<QByteArray> *)0x35d7d8);
  }
  if (platform_integration == (QPlatformIntegration *)0x0) {
    createPlatformIntegration(in_stack_fffffffffffffd70);
  }
  updatePalette();
  QFont::initialize();
  initThemeHints();
  QCursorData::initialize();
  qRegisterGuiVariant();
  qRegisterGuiGetInterpolator();
  QCoreApplication::instance();
  uVar5 = QCoreApplication::testAttribute(AA_ShareOpenGLContexts);
  if (((uVar5 & 1) != 0) && (pQVar6 = qt_gl_global_share_context(), pQVar6 == (QOpenGLContext *)0x0)
     ) {
    in_stack_fffffffffffffd48 = (Object *)operator_new(0x10);
    QOpenGLContext::QOpenGLContext
              ((QOpenGLContext *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    in_stack_fffffffffffffd50 = in_stack_fffffffffffffd48;
    in_stack_fffffffffffffd80 = in_stack_fffffffffffffd48;
    QSurfaceFormat::defaultFormat();
    QOpenGLContext::setFormat
              ((QOpenGLContext *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (QSurfaceFormat *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    QSurfaceFormat::~QSurfaceFormat
              ((QSurfaceFormat *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    QOpenGLContext::create((QOpenGLContext *)in_stack_fffffffffffffd38);
    qt_gl_set_global_share_context((QOpenGLContext *)in_stack_fffffffffffffd80);
    this->ownGlobalShareContext = true;
  }
  QElapsedTimer::start();
  QCoreApplicationPrivate::is_app_running._0_1_ = 1;
  init_plugins((QList<QByteArray> *)in_stack_fffffffffffffd40);
  QFlags<QEventLoop::ProcessEventsFlag>::QFlags
            ((QFlags<QEventLoop::ProcessEventsFlag> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),in_stack_fffffffffffffd2c
            );
  QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)flags.i);
  context = q_func(this);
  this_00 = (QMessageLogger *)operator_new(0x10);
  QSessionManager::QSessionManager
            ((QSessionManager *)in_stack_fffffffffffffd50,
             (QGuiApplication *)in_stack_fffffffffffffd48,(QString *)this_00,
             (QString *)in_stack_fffffffffffffd38);
  this->session_manager = (QSessionManager *)this_00;
  iVar4 = qEnvironmentVariableIntValue("QT_LOAD_TESTABILITY",(bool *)0x0);
  if (0 < iVar4) {
    in_stack_fffffffffffffda4 = CONCAT13(1,(int3)in_stack_fffffffffffffda4);
  }
  if ((in_stack_fffffffffffffda4 & 0x1000000) != 0) {
    local_190 = &DAT_aaaaaaaaaaaaaaaa;
    local_188 = &DAT_aaaaaaaaaaaaaaaa;
    local_180 = &DAT_aaaaaaaaaaaaaaaa;
    type = (ConnectionType)&local_1c0;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_1c0,(Data *)0x0,L"qttestability",0xd);
    QString::QString((QString *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    QLibrary::QLibrary((QLibrary *)&local_190,(QString *)local_1a8,(QObject *)0x0);
    QString::~QString((QString *)0x35da0f);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)
               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    bVar2 = QLibrary::load();
    if (((bVar2 ^ 0xff) & 1) == 0) {
      in_stack_fffffffffffffd70 = (QGuiApplicationPrivate *)QLibrary::resolve((char *)&local_190);
      if (in_stack_fffffffffffffd70 == (QGuiApplicationPrivate *)0x0) {
        QMessageLogger::QMessageLogger
                  (this_00,(char *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,
                   (char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        QMessageLogger::critical(local_220,"Library qttestability resolve failed!");
      }
      else {
        (*(code *)in_stack_fffffffffffffd70)();
      }
    }
    else {
      QMessageLogger::QMessageLogger
                (this_00,(char *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,
                 (char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      QMessageLogger::critical();
      t = (QString *)QDebug::operator<<((QDebug *)in_stack_fffffffffffffd48,(char *)context);
      QLibrary::errorString();
      QDebug::operator<<((QDebug *)this_00,t);
      QString::~QString((QString *)0x35dab0);
      QDebug::~QDebug(&local_1c8);
    }
    QLibrary::~QLibrary((QLibrary *)&local_190);
  }
  QGuiApplication::setLayoutDirection(LeftToRight);
  if (displayName == (QString *)0x0) {
    QObject::connect<void(QCoreApplication::*)(),void(QGuiApplication::*)()>
              (in_stack_fffffffffffffd80,CONCAT44(in_stack_fffffffffffffda4,uVar3),context,
               (offset_in_QGuiApplication_to_subr *)in_stack_fffffffffffffd70,type);
    QMetaObject::Connection::~Connection(local_228);
  }
  QByteArray::~QByteArray((QByteArray *)0x35dbc0);
  QString::~QString((QString *)0x35dbcd);
  QString::~QString((QString *)0x35dbda);
  QString::~QString((QString *)0x35dbe7);
  QList<QByteArray>::~QList((QList<QByteArray> *)0x35dbf4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

QGuiApplicationPrivate::init()
{
    Q_TRACE_SCOPE(QGuiApplicationPrivate_init);

#if defined(Q_OS_MACOS)
    QMacAutoReleasePool pool;
#endif

    QCoreApplicationPrivate::init();

    QCoreApplicationPrivate::is_app_running = false; // Starting up.

    bool loadTestability = false;
    QList<QByteArray> pluginList;
    // Get command line params
#ifndef QT_NO_SESSIONMANAGER
    QString session_id;
    QString session_key;
# if defined(Q_OS_WIN)
    wchar_t guidstr[40];
    GUID guid;
    CoCreateGuid(&guid);
    StringFromGUID2(guid, guidstr, 40);
    session_id = QString::fromWCharArray(guidstr);
    CoCreateGuid(&guid);
    StringFromGUID2(guid, guidstr, 40);
    session_key = QString::fromWCharArray(guidstr);
# endif
#endif
    QString s;
    int j = argc ? 1 : 0;
    for (int i=1; i<argc; i++) {
        if (!argv[i])
            continue;
        if (*argv[i] != '-') {
            argv[j++] = argv[i];
            continue;
        }
        const char *arg = argv[i];
        if (arg[1] == '-') // startsWith("--")
            ++arg;
        if (strcmp(arg, "-plugin") == 0) {
            if (++i < argc)
                pluginList << argv[i];
        } else if (strcmp(arg, "-reverse") == 0) {
            force_reverse = true;
#ifdef Q_OS_MAC
        } else if (strncmp(arg, "-psn_", 5) == 0) {
            // eat "-psn_xxxx" on Mac, which is passed when starting an app from Finder.
            // special hack to change working directory (for an app bundle) when running from finder
            if (QDir::currentPath() == "/"_L1) {
                QCFType<CFURLRef> bundleURL(CFBundleCopyBundleURL(CFBundleGetMainBundle()));
                QString qbundlePath = QCFString(CFURLCopyFileSystemPath(bundleURL,
                                                                        kCFURLPOSIXPathStyle));
                if (qbundlePath.endsWith(".app"_L1))
                    QDir::setCurrent(qbundlePath.section(u'/', 0, -2));
            }
#endif
#ifndef QT_NO_SESSIONMANAGER
        } else if (strcmp(arg, "-session") == 0 && i < argc - 1) {
            ++i;
            if (argv[i] && *argv[i]) {
                session_id = QString::fromLatin1(argv[i]);
                qsizetype p = session_id.indexOf(u'_');
                if (p >= 0) {
                    session_key = session_id.mid(p +1);
                    session_id = session_id.left(p);
                }
                is_session_restored = true;
            }
#endif
        } else if (strcmp(arg, "-testability") == 0) {
            loadTestability = true;
        } else if (strncmp(arg, "-style=", 7) == 0) {
            s = QString::fromLocal8Bit(arg + 7);
        } else if (strcmp(arg, "-style") == 0 && i < argc - 1) {
            s = QString::fromLocal8Bit(argv[++i]);
        } else {
            argv[j++] = argv[i];
        }

        if (!s.isEmpty())
            styleOverride = s;
    }

    if (j < argc) {
        argv[j] = nullptr;
        argc = j;
    }

    // Load environment exported generic plugins
    QByteArray envPlugins = qgetenv("QT_QPA_GENERIC_PLUGINS");
    if (!envPlugins.isEmpty())
        pluginList += envPlugins.split(',');

    if (platform_integration == nullptr)
        createPlatformIntegration();

    updatePalette();
    QFont::initialize();
    initThemeHints();

#ifndef QT_NO_CURSOR
    QCursorData::initialize();
#endif

    // trigger registering of QVariant's GUI types
    qRegisterGuiVariant();

#if QT_CONFIG(animation)
    // trigger registering of animation interpolators
    qRegisterGuiGetInterpolator();
#endif

    // set a global share context when enabled unless there is already one
#ifndef QT_NO_OPENGL
    if (qApp->testAttribute(Qt::AA_ShareOpenGLContexts) && !qt_gl_global_share_context()) {
        QOpenGLContext *ctx = new QOpenGLContext;
        ctx->setFormat(QSurfaceFormat::defaultFormat());
        ctx->create();
        qt_gl_set_global_share_context(ctx);
        ownGlobalShareContext = true;
    }
#endif

    QWindowSystemInterfacePrivate::eventTime.start();

    is_app_running = true;
    init_plugins(pluginList);
    QWindowSystemInterface::flushWindowSystemEvents();

    Q_Q(QGuiApplication);
#ifndef QT_NO_SESSIONMANAGER
    // connect to the session manager
    session_manager = new QSessionManager(q, session_id, session_key);
#endif

#if QT_CONFIG(library)
    if (qEnvironmentVariableIntValue("QT_LOAD_TESTABILITY") > 0)
        loadTestability = true;

    if (loadTestability) {
        QLibrary testLib(QStringLiteral("qttestability"));
        if (Q_UNLIKELY(!testLib.load())) {
            qCritical() << "Library qttestability load failed:" << testLib.errorString();
        } else {
            typedef void (*TasInitialize)(void);
            TasInitialize initFunction = (TasInitialize)testLib.resolve("qt_testability_init");
            if (Q_UNLIKELY(!initFunction)) {
                qCritical("Library qttestability resolve failed!");
            } else {
                initFunction();
            }
        }
    }
#else
    Q_UNUSED(loadTestability);
#endif // QT_CONFIG(library)

    // trigger changed signal and event delivery
    QGuiApplication::setLayoutDirection(layout_direction);

    if (!QGuiApplicationPrivate::displayName)
        QObject::connect(q, &QGuiApplication::applicationNameChanged,
                         q, &QGuiApplication::applicationDisplayNameChanged);
}